

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale_tools.h
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
to_correct_string<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,string *e,locale *param_2)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"UTF-8",&local_39);
  booster::locale::conv::to_utf<wchar_t>(__return_storage_ptr__,e,&local_38,default_method);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> to_correct_string(std::string const &e,std::locale /*l*/)
{
    return booster::locale::conv::to_utf<Char>(e,"UTF-8");
}